

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void set_partition_cost_for_edge_blk(AV1_COMMON *cm,PartitionSearchState *part_search_state)

{
  int iVar1;
  aom_cdf_prob *cdf;
  long in_RSI;
  long in_RDI;
  aom_cdf_prob rhs_cdf [2];
  aom_cdf_prob bot_cdf [2];
  PARTITION_TYPE i;
  int max_cost;
  aom_cdf_prob *partition_cdf;
  PartitionBlkParams blk_params;
  aom_cdf_prob *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  byte bVar2;
  undefined2 uVar3;
  aom_cdf_prob in_stack_ffffffffffffffb6;
  undefined2 uVar4;
  int *in_stack_ffffffffffffffc0;
  int local_1c;
  int local_18;
  
  memcpy(&stack0xffffffffffffffc4,(void *)(in_RSI + 8),0x2c);
  cdf = (aom_cdf_prob *)
        (*(long *)(in_RDI + 0x6090) + 0x3532 + (long)*(int *)(in_RSI + 0x140) * 0x16);
  iVar1 = av1_cost_symbol(in_stack_ffffffffffffffb6);
  uVar3 = (undefined2)iVar1;
  uVar4 = (undefined2)((uint)iVar1 >> 0x10);
  for (in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 & 0xffffff;
      bVar2 = (byte)(in_stack_ffffffffffffffb0 >> 0x18), bVar2 < 4;
      in_stack_ffffffffffffffb0 = CONCAT13(bVar2 + 1,(int3)in_stack_ffffffffffffffb0)) {
    *(int *)(in_RSI + 0xa8 + (ulong)bVar2 * 4) = iVar1;
  }
  if (local_18 == 0) {
    if (local_1c == 0) {
      *(undefined4 *)(in_RSI + 0xb4) = 0;
    }
    else {
      partition_gather_horz_alike
                ((aom_cdf_prob *)CONCAT26(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffb0)),
                 in_stack_ffffffffffffffa8,BLOCK_4X4);
      av1_cost_tokens_from_cdf
                (in_stack_ffffffffffffffc0,cdf,
                 (int *)CONCAT26(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffb0)));
    }
  }
  else {
    partition_gather_vert_alike
              ((aom_cdf_prob *)CONCAT26(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffb0)),
               in_stack_ffffffffffffffa8,BLOCK_4X4);
    av1_cost_tokens_from_cdf
              (in_stack_ffffffffffffffc0,cdf,
               (int *)CONCAT26(uVar4,CONCAT24(uVar3,in_stack_ffffffffffffffb0)));
  }
  *(long *)(in_RSI + 0xb8) = in_RSI + 0xa8;
  return;
}

Assistant:

static void set_partition_cost_for_edge_blk(
    AV1_COMMON const *cm, PartitionSearchState *part_search_state) {
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  assert(blk_params.bsize_at_least_8x8 && part_search_state->pl_ctx_idx >= 0);
  const aom_cdf_prob *partition_cdf =
      cm->fc->partition_cdf[part_search_state->pl_ctx_idx];
  const int max_cost = av1_cost_symbol(0);
  for (PARTITION_TYPE i = 0; i < PARTITION_TYPES; ++i)
    part_search_state->tmp_partition_cost[i] = max_cost;
  if (blk_params.has_cols) {
    // At the bottom, the two possibilities are HORZ and SPLIT.
    aom_cdf_prob bot_cdf[2];
    partition_gather_vert_alike(bot_cdf, partition_cdf, blk_params.bsize);
    static const int bot_inv_map[2] = { PARTITION_HORZ, PARTITION_SPLIT };
    av1_cost_tokens_from_cdf(part_search_state->tmp_partition_cost, bot_cdf,
                             bot_inv_map);
  } else if (blk_params.has_rows) {
    // At the right, the two possibilities are VERT and SPLIT.
    aom_cdf_prob rhs_cdf[2];
    partition_gather_horz_alike(rhs_cdf, partition_cdf, blk_params.bsize);
    static const int rhs_inv_map[2] = { PARTITION_VERT, PARTITION_SPLIT };
    av1_cost_tokens_from_cdf(part_search_state->tmp_partition_cost, rhs_cdf,
                             rhs_inv_map);
  } else {
    // At the bottom right, we always split.
    part_search_state->tmp_partition_cost[PARTITION_SPLIT] = 0;
  }
  // Override the partition cost buffer.
  part_search_state->partition_cost = part_search_state->tmp_partition_cost;
}